

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

void __thiscall
cppcms::applications_pool::unmount
          (applications_pool *this,weak_ptr<cppcms::application_specific_pool> *wgen)

{
  bool bVar1;
  const_iterator __position;
  long in_RDI;
  iterator it;
  unique_lock<std::recursive_mutex> lock;
  shared_ptr<cppcms::application_specific_pool> gen;
  mutex_type *in_stack_ffffffffffffff68;
  _data *in_stack_ffffffffffffff70;
  weak_ptr<cppcms::application_specific_pool> *in_stack_ffffffffffffff78;
  _List_const_iterator<cppcms::applications_pool::_data::attachment> local_60;
  _Self local_58;
  _Self local_50 [5];
  undefined4 local_24;
  __shared_ptr local_20 [32];
  
  std::weak_ptr<cppcms::application_specific_pool>::lock(in_stack_ffffffffffffff78);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    booster::hold_ptr<cppcms::applications_pool::_data>::operator->
              ((hold_ptr<cppcms::applications_pool::_data> *)(in_RDI + 8));
    std::unique_lock<std::recursive_mutex>::unique_lock
              ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    booster::hold_ptr<cppcms::applications_pool::_data>::operator->
              ((hold_ptr<cppcms::applications_pool::_data> *)(in_RDI + 8));
    local_50[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
         ::begin((list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
                  *)in_stack_ffffffffffffff68);
    while( true ) {
      __position._M_node =
           (_List_node_base *)
           booster::hold_ptr<cppcms::applications_pool::_data>::operator->
                     ((hold_ptr<cppcms::applications_pool::_data> *)(in_RDI + 8));
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
           ::end((list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
                  *)in_stack_ffffffffffffff68);
      bVar1 = std::operator!=(local_50,&local_58);
      if (!bVar1) break;
      std::_List_iterator<cppcms::applications_pool::_data::attachment>::operator->
                ((_List_iterator<cppcms::applications_pool::_data::attachment> *)0x3ab24d);
      bVar1 = std::operator==((shared_ptr<cppcms::application_specific_pool> *)
                              in_stack_ffffffffffffff70,
                              (shared_ptr<cppcms::application_specific_pool> *)
                              in_stack_ffffffffffffff68);
      if (bVar1) {
        in_stack_ffffffffffffff70 =
             booster::hold_ptr<cppcms::applications_pool::_data>::operator->
                       ((hold_ptr<cppcms::applications_pool::_data> *)(in_RDI + 8));
        std::_List_const_iterator<cppcms::applications_pool::_data::attachment>::
        _List_const_iterator(&local_60,local_50);
        std::__cxx11::
        list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
        ::erase(&in_stack_ffffffffffffff70->apps,__position);
        local_24 = 1;
        goto LAB_003ab2e9;
      }
      std::_List_iterator<cppcms::applications_pool::_data::attachment>::operator++(local_50);
    }
    local_24 = 0;
LAB_003ab2e9:
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff70);
  }
  else {
    local_24 = 1;
  }
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x3ab2fd);
  return;
}

Assistant:

void applications_pool::unmount(booster::weak_ptr<application_specific_pool> wgen)
{
	booster::shared_ptr<application_specific_pool> gen = wgen.lock();
	if(!gen) return;
	
	booster::unique_lock<booster::recursive_mutex> lock(d->lock);

	for(std::list<_data::attachment>::iterator it = d->apps.begin();it!=d->apps.end();++it) {
		if(it->pool == gen) {
			d->apps.erase(it);
			return;
		}
	}
}